

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_parse_function_generator.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::ParseFunctionGenerator::GenerateTailCallTable
          (ParseFunctionGenerator *this,Formatter *format)

{
  byte bVar1;
  int *args;
  FileOptions_OptimizeMode FVar2;
  LogMessage *other;
  int *in_RCX;
  Options *in_RDX;
  Options *extraout_RDX;
  char *format_00;
  int local_a0;
  int local_9c;
  ScopedIndenter header_scope;
  ScopedIndenter fast_scope;
  ScopedIndenter table_scope;
  string fallback;
  
  if (this->options_->tctable_mode == kTCTableNever) {
    in_RCX = (int *)0x21d;
    internal::LogMessage::LogMessage
              ((LogMessage *)&fallback,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_parse_function_generator.cc"
               ,0x21d);
    other = internal::LogMessage::operator<<
                      ((LogMessage *)&fallback,"CHECK failed: should_generate_tctable(): ");
    internal::LogFinisher::operator=((LogFinisher *)&fast_scope,other);
    internal::LogMessage::~LogMessage((LogMessage *)&fallback);
    in_RDX = extraout_RDX;
  }
  fallback._M_dataplus._M_p = (pointer)&fallback.field_2;
  fallback._M_string_length = 0;
  fallback.field_2._M_local_buf[0] = '\0';
  if (((this->tc_table_info_)._M_t.
       super___uniq_ptr_impl<google::protobuf::compiler::cpp::TailCallTableInfo,_std::default_delete<google::protobuf::compiler::cpp::TailCallTableInfo>_>
       ._M_t.
       super__Tuple_impl<0UL,_google::protobuf::compiler::cpp::TailCallTableInfo_*,_std::default_delete<google::protobuf::compiler::cpp::TailCallTableInfo>_>
       .super__Head_base<0UL,_google::protobuf::compiler::cpp::TailCallTableInfo_*,_false>.
      _M_head_impl)->use_generated_fallback == true) {
    ClassName_abi_cxx11_((string *)&table_scope,(cpp *)this->descriptor_,(Descriptor *)in_RDX);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fast_scope,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&table_scope
                   ,"::Tct_ParseFallback");
    std::__cxx11::string::operator=((string *)&fallback,(string *)&fast_scope);
    std::__cxx11::string::~string((string *)&fast_scope);
    std::__cxx11::string::~string((string *)&table_scope);
  }
  else {
    (anonymous_namespace)::TcParserName_abi_cxx11_
              ((string *)&table_scope,(_anonymous_namespace_ *)this->options_,in_RDX);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fast_scope,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&table_scope
                   ,"GenericFallback");
    std::__cxx11::string::operator=((string *)&fallback,(string *)&fast_scope);
    std::__cxx11::string::~string((string *)&fast_scope);
    std::__cxx11::string::~string((string *)&table_scope);
    FVar2 = GetOptimizeFor(*(FileDescriptor **)(this->descriptor_ + 0x10),this->options_);
    if (FVar2 == FileOptions_OptimizeMode_LITE_RUNTIME) {
      std::__cxx11::string::append((char *)&fallback);
    }
  }
  Formatter::operator()
            (format,
             "const ::$proto_ns$::internal::TcParseTable<$1$>\n    $classname$::_table_ = {\n",
             &((this->tc_table_info_)._M_t.
               super___uniq_ptr_impl<google::protobuf::compiler::cpp::TailCallTableInfo,_std::default_delete<google::protobuf::compiler::cpp::TailCallTableInfo>_>
               ._M_t.
               super__Tuple_impl<0UL,_google::protobuf::compiler::cpp::TailCallTableInfo_*,_std::default_delete<google::protobuf::compiler::cpp::TailCallTableInfo>_>
               .super__Head_base<0UL,_google::protobuf::compiler::cpp::TailCallTableInfo_*,_false>.
              _M_head_impl)->table_size_log2);
  table_scope.format_ = format;
  Formatter::Indent(format);
  Formatter::operator()<>(format,"{\n");
  header_scope.format_ = format;
  Formatter::Indent(format);
  if ((this->num_hasbits_ < 1) && (*(char *)(*(long *)(this->descriptor_ + 0x20) + 0x4b) != '\x01'))
  {
    format_00 = "0,  // no _has_bits_\n";
  }
  else {
    format_00 = "PROTOBUF_FIELD_OFFSET($classname$, _has_bits_),\n";
  }
  Formatter::operator()<>(format,format_00);
  if (*(int *)(this->descriptor_ + 0x78) == 1) {
    args = *(int **)(this->descriptor_ + 0x48);
    in_RCX = args + 1;
    Formatter::operator()
              (format,
               "PROTOBUF_FIELD_OFFSET($classname$, _extensions_),\n$1$, $2$,  // extension_range_{low,high}\n"
               ,args,in_RCX);
  }
  else {
    Formatter::operator()<>(format,"0, 0, 0,  // no _extensions_\n");
  }
  bVar1 = (byte)((this->tc_table_info_)._M_t.
                 super___uniq_ptr_impl<google::protobuf::compiler::cpp::TailCallTableInfo,_std::default_delete<google::protobuf::compiler::cpp::TailCallTableInfo>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_google::protobuf::compiler::cpp::TailCallTableInfo_*,_std::default_delete<google::protobuf::compiler::cpp::TailCallTableInfo>_>
                 .super__Head_base<0UL,_google::protobuf::compiler::cpp::TailCallTableInfo_*,_false>
                ._M_head_impl)->table_size_log2;
  local_9c = ~(-1 << (bVar1 & 0x1f)) << 3;
  local_a0 = *(int *)((cpp *)this->descriptor_ + 4);
  DefaultInstanceName_abi_cxx11_
            ((string *)&fast_scope,(cpp *)this->descriptor_,(Descriptor *)this->options_,
             (Options *)CONCAT71((int7)((ulong)in_RCX >> 8),bVar1));
  Formatter::operator()
            (format,
             "$1$, 0, $2$,  // fast_idx_mask, reserved, num_fields\n&$3$._instance,\n$4$  // fallback\n"
             ,&local_9c,&local_a0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fast_scope,
             &fallback);
  std::__cxx11::string::~string((string *)&fast_scope);
  Formatter::ScopedIndenter::~ScopedIndenter(&header_scope);
  Formatter::operator()<>(format,"}, {\n");
  fast_scope.format_ = format;
  Formatter::Indent(format);
  GenerateFastFieldEntries(this,format,&fallback);
  Formatter::ScopedIndenter::~ScopedIndenter(&fast_scope);
  Formatter::operator()<>(format,"},\n");
  Formatter::ScopedIndenter::~ScopedIndenter(&table_scope);
  Formatter::operator()<>(format,"};\n\n");
  std::__cxx11::string::~string((string *)&fallback);
  return;
}

Assistant:

void ParseFunctionGenerator::GenerateTailCallTable(Formatter& format) {
  GOOGLE_CHECK(should_generate_tctable());
  // All entries without a fast-path parsing function need a fallback.
  std::string fallback;
  if (tc_table_info_->use_generated_fallback) {
    fallback = ClassName(descriptor_) + "::Tct_ParseFallback";
  } else {
    fallback = TcParserName(options_) + "GenericFallback";
    if (GetOptimizeFor(descriptor_->file(), options_) ==
        FileOptions::LITE_RUNTIME) {
      fallback += "Lite";
    }
  }

  // For simplicity and speed, the table is not covering all proto
  // configurations. This model uses a fallback to cover all situations that
  // the table can't accommodate, together with unknown fields or extensions.
  // These are number of fields over 32, fields with 3 or more tag bytes,
  // maps, weak fields, lazy, more than 1 extension range. In the cases
  // the table is sufficient we can use a generic routine, that just handles
  // unknown fields and potentially an extension range.
  format(
      "const ::$proto_ns$::internal::TcParseTable<$1$>\n"
      "    $classname$::_table_ = {\n",
      tc_table_info_->table_size_log2);
  {
    auto table_scope = format.ScopedIndent();
    format("{\n");
    {
      auto header_scope = format.ScopedIndent();
      if (num_hasbits_ > 0 || IsMapEntryMessage(descriptor_)) {
        format("PROTOBUF_FIELD_OFFSET($classname$, _has_bits_),\n");
      } else {
        format("0,  // no _has_bits_\n");
      }
      if (descriptor_->extension_range_count() == 1) {
        format(
            "PROTOBUF_FIELD_OFFSET($classname$, _extensions_),\n"
            "$1$, $2$,  // extension_range_{low,high}\n",
            descriptor_->extension_range(0)->start,
            descriptor_->extension_range(0)->end);
      } else {
        format("0, 0, 0,  // no _extensions_\n");
      }
      format(
          "$1$, 0, $2$,  // fast_idx_mask, reserved, num_fields\n"
          "&$3$._instance,\n"
          "$4$  // fallback\n",
          (((1 << tc_table_info_->table_size_log2) - 1) << 3),
          descriptor_->field_count(),
          DefaultInstanceName(descriptor_, options_), fallback);
    }
    format("}, {\n");
    {
      auto fast_scope = format.ScopedIndent();
      GenerateFastFieldEntries(format, fallback);
    }
    format("},\n");  // entries[]
  }
  format("};\n\n");  // _table_
}